

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiNextWindowData::ImGuiNextWindowData(ImGuiNextWindowData *this)

{
  undefined4 *in_RDI;
  ImVec2 in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  ImVec2 local_18;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 7));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 9));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xb));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xd));
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffffd0);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x19));
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *in_RDI = 0;
  ImVec2::ImVec2(local_10,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0xb) = local_10[0];
  *(undefined8 *)(in_RDI + 9) = *(undefined8 *)(in_RDI + 0xb);
  *(undefined8 *)(in_RDI + 7) = *(undefined8 *)(in_RDI + 9);
  ImVec2::ImVec2(&local_18,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0xd) = local_18;
  *(undefined1 *)(in_RDI + 0xf) = 0;
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffffd0);
  *(undefined8 *)(in_RDI + 0x10) = local_28;
  *(undefined8 *)(in_RDI + 0x12) = local_20;
  *(undefined8 *)(in_RDI + 0x14) = 0;
  *(undefined8 *)(in_RDI + 0x16) = 0;
  in_RDI[0x18] = 0x7f7fffff;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x19) = in_stack_ffffffffffffffd0;
  return;
}

Assistant:

ImGuiNextWindowData()
    {
        PosCond = SizeCond = ContentSizeCond = CollapsedCond = SizeConstraintCond = FocusCond = BgAlphaCond = 0;
        PosVal = PosPivotVal = SizeVal = ImVec2(0.0f, 0.0f);
        ContentSizeVal = ImVec2(0.0f, 0.0f);
        CollapsedVal = false;
        SizeConstraintRect = ImRect();
        SizeCallback = NULL;
        SizeCallbackUserData = NULL;
        BgAlphaVal = FLT_MAX;
        MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    }